

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFeaturePrintValidatorTests.cpp
# Opt level: O2

int testAudioFeatureSoundPrintBasic(void)

{
  bool bVar1;
  ArrayFeatureType *pAVar2;
  FeatureType *this;
  FeatureType *this_00;
  ModelDescription *this_01;
  FeatureDescription *pFVar3;
  FeatureDescription *pFVar4;
  ostream *poVar5;
  AudioFeaturePrint *this_02;
  ostream *this_03;
  AudioFeaturePrint_Sound *pAVar6;
  int iVar7;
  char *pcVar8;
  undefined1 auStack_a8 [40];
  Result result;
  Model model;
  
  pAVar2 = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar2);
  this = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this);
  CoreML::Specification::FeatureType::set_allocated_multiarraytype(this,pAVar2);
  pAVar2 = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar2);
  this_00 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_00);
  CoreML::Specification::FeatureType::set_allocated_multiarraytype(this_00,pAVar2);
  this_01 = (ModelDescription *)operator_new(0x78);
  CoreML::Specification::ModelDescription::ModelDescription(this_01);
  pFVar3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&this_01->input_);
  pFVar4 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&this_01->output_);
  if (pFVar3->type_ != (FeatureType *)0x0) {
    (*(pFVar3->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pFVar3->type_ = this;
  if (pFVar4->type_ != (FeatureType *)0x0) {
    (*(pFVar4->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pFVar4->type_ = this_00;
  CoreML::Specification::Model::Model(&model);
  if (model.description_ != (ModelDescription *)0x0) {
    (*((model.description_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  model.description_ = this_01;
  CoreML::validate<(MLModelType)2006>(&result,&model);
  bVar1 = CoreML::Result::good(&result);
  if (bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/AudioFeaturePrintValidatorTests.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x29);
    poVar5 = std::operator<<(poVar5,": error: ");
    poVar5 = std::operator<<(poVar5,"!((result).good())");
    poVar5 = std::operator<<(poVar5," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  else {
    this_02 = CoreML::Specification::Model::mutable_audiofeatureprint(&model);
    CoreML::validate<(MLModelType)2006>((Result *)auStack_a8,&model);
    CoreML::Result::operator=(&result,(Result *)auStack_a8);
    std::__cxx11::string::~string((string *)(auStack_a8 + 8));
    bVar1 = CoreML::Result::good(&result);
    if (bVar1) {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/AudioFeaturePrintValidatorTests.cpp"
                              );
      this_03 = (ostream *)std::operator<<(poVar5,":");
      iVar7 = 0x2d;
LAB_00162ff8:
      poVar5 = (ostream *)std::ostream::operator<<(this_03,iVar7);
      poVar5 = std::operator<<(poVar5,": error: ");
      pcVar8 = "!((result).good())";
    }
    else {
      CoreML::Specification::CoreMLModels::AudioFeaturePrint::mutable_sound(this_02);
      CoreML::validate<(MLModelType)2006>((Result *)auStack_a8,&model);
      CoreML::Result::operator=(&result,(Result *)auStack_a8);
      std::__cxx11::string::~string((string *)(auStack_a8 + 8));
      bVar1 = CoreML::Result::good(&result);
      if (bVar1) {
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/AudioFeaturePrintValidatorTests.cpp"
                                );
        this_03 = (ostream *)std::operator<<(poVar5,":");
        iVar7 = 0x31;
        goto LAB_00162ff8;
      }
      pAVar6 = CoreML::Specification::CoreMLModels::AudioFeaturePrint::mutable_sound(this_02);
      pAVar6->version_ = 1;
      CoreML::validate<(MLModelType)2006>((Result *)auStack_a8,&model);
      CoreML::Result::operator=(&result,(Result *)auStack_a8);
      std::__cxx11::string::~string((string *)(auStack_a8 + 8));
      bVar1 = CoreML::Result::good(&result);
      iVar7 = 0;
      if (bVar1) goto LAB_00163039;
      poVar5 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/AudioFeaturePrintValidatorTests.cpp"
                              );
      poVar5 = std::operator<<(poVar5,":");
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x35);
      poVar5 = std::operator<<(poVar5,": error: ");
      pcVar8 = "(result).good()";
    }
    poVar5 = std::operator<<(poVar5,pcVar8);
    poVar5 = std::operator<<(poVar5," was false, expected true.");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  iVar7 = 1;
LAB_00163039:
  std::__cxx11::string::~string((string *)&result.m_message);
  CoreML::Specification::Model::~Model(&model);
  return iVar7;
}

Assistant:

int testAudioFeatureSoundPrintBasic() {

    Specification::ArrayFeatureType* inputArrayFeatureType = new Specification::ArrayFeatureType();
    Specification::FeatureType* inputFeatureType = new Specification::FeatureType();
    inputFeatureType->set_allocated_multiarraytype(inputArrayFeatureType);

    Specification::ArrayFeatureType* outputArrayFeatureType = new Specification::ArrayFeatureType();
    Specification::FeatureType* outputFeatureType = new Specification::FeatureType();
    outputFeatureType->set_allocated_multiarraytype(outputArrayFeatureType);

    Specification::ModelDescription* description = new Specification::ModelDescription();
    Specification::FeatureDescription* input = description->add_input();
    Specification::FeatureDescription* output = description->add_output();
    input->set_allocated_type(inputFeatureType);
    output->set_allocated_type(outputFeatureType);

    Specification::Model model;
    model.set_allocated_description(description);

    Result result = validate<MLModelType_audioFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    auto *p = model.mutable_audiofeatureprint();
    result = validate<MLModelType_audioFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    p->mutable_sound();
    result = validate<MLModelType_audioFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    p->mutable_sound()->set_version(Specification::CoreMLModels::AudioFeaturePrint_Sound_SoundVersion_SOUND_VERSION_1);
    result = validate<MLModelType_audioFeaturePrint>(model);
    ML_ASSERT_GOOD(result);
    
    return 0;
}